

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O3

int zueci_encode_utf8(zueci_u32 u,uchar *dest)

{
  byte bVar1;
  
  bVar1 = (byte)u;
  if (u < 0x80) {
    *dest = bVar1;
    return 1;
  }
  if (u < 0x800) {
    *dest = (byte)(u >> 6) | 0xc0;
    dest[1] = bVar1 & 0x3f | 0x80;
    return 2;
  }
  if (u < 0x10000) {
    *dest = (byte)(u >> 0xc) | 0xe0;
    dest[1] = (byte)(u >> 6) & 0x3f | 0x80;
    dest[2] = bVar1 & 0x3f | 0x80;
    return 3;
  }
  *dest = (byte)(u >> 0x12) | 0xf0;
  dest[1] = (byte)(u >> 0xc) & 0x3f | 0x80;
  dest[2] = (byte)(u >> 6) & 0x3f | 0x80;
  dest[3] = bVar1 & 0x3f | 0x80;
  return 4;
}

Assistant:

static int zueci_encode_utf8(const zueci_u32 u, unsigned char *dest) {
    if (u < 0x80) {
        dest[0] = (unsigned char) u;
        return 1;
    }
    if (u < 0x800) {
        dest[0] = (unsigned char) (0xC0 | (u >> 6));
        dest[1] = (unsigned char) (0x80 | (u & 0x3F));
        return 2;
    }
    if (u < 0x10000) {
        dest[0] = (unsigned char) (0xE0 | (u >> 12));
        dest[1] = (unsigned char) (0x80 | ((u >> 6) & 0x3F));
        dest[2] = (unsigned char) (0x80 | (u & 0x3F));
        return 3;
    }
    dest[0] = (unsigned char) (0xF0 | (u >> 18));
    dest[1] = (unsigned char) (0x80 | ((u >> 12) & 0x3F));
    dest[2] = (unsigned char) (0x80 | ((u >> 6) & 0x3F));
    dest[3] = (unsigned char) (0x80 | (u & 0x3F));
    return 4;
}